

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testComparators<Imath_3_2::Vec3<short>>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  Box<Imath_3_2::Vec3<short>_> *pBVar5;
  reference pvVar6;
  Vec3<short> *maxT;
  Vec3<short> *pVVar7;
  Vec3<short> *pVVar8;
  char *in_RDI;
  Box<Imath_3_2::Vec3<short>_> b2;
  Box<Imath_3_2::Vec3<short>_> b1_2;
  Box<Imath_3_2::Vec3<short>_> b0_2;
  Vec3<short> p3;
  Vec3<short> p2;
  Vec3<short> p1_1;
  Vec3<short> p0_1;
  uint j_1;
  uint i_1;
  vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> perms_1;
  Box<Imath_3_2::Vec3<short>_> b1_1;
  Box<Imath_3_2::Vec3<short>_> b0_1;
  Vec3<short> p1;
  Vec3<short> p0;
  uint j;
  uint i;
  vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> perms;
  Box<Imath_3_2::Vec3<short>_> b1;
  Box<Imath_3_2::Vec3<short>_> b0;
  Rand32 rand;
  Vec3<short> *in_stack_fffffffffffffef8;
  Box<Imath_3_2::Vec3<short>_> *in_stack_ffffffffffffff00;
  Box<Imath_3_2::Vec3<short>_> *in_stack_ffffffffffffff08;
  Box<Imath_3_2::Vec3<short>_> *in_stack_ffffffffffffff10;
  vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
  *in_stack_ffffffffffffff40;
  Vec3<short> local_b0 [2];
  Vec3<short> local_a4 [2];
  uint local_98;
  uint local_94;
  vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> local_90 [2];
  Vec3<short> local_60 [2];
  uint local_54;
  uint local_50;
  vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> local_40 [2];
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    comparators for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand32::Rand32
            ((Rand32 *)in_stack_ffffffffffffff00,(unsigned_long)in_stack_fffffffffffffef8);
  Imath_3_2::Box<Imath_3_2::Vec3<short>_>::Box(in_stack_ffffffffffffff00);
  Imath_3_2::Box<Imath_3_2::Vec3<short>_>::Box(in_stack_ffffffffffffff00);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (!bVar1) {
    __assert_fail("b0 == b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x179,
                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                 );
  }
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(b0 != b1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x17a,
                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                 );
  }
  std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::vector
            ((vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> *)0x11b478);
  permutations<Imath_3_2::Vec3<short>>(in_stack_ffffffffffffff40);
  for (local_50 = 0; uVar3 = (ulong)local_50,
      sVar4 = std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::size
                        (local_40), uVar3 < sVar4; local_50 = local_50 + 1) {
    local_54 = 0;
    while( true ) {
      in_stack_ffffffffffffff10 = (Box<Imath_3_2::Vec3<short>_> *)(ulong)local_54;
      pBVar5 = (Box<Imath_3_2::Vec3<short>_> *)
               std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::size
                         (local_40);
      if (pBVar5 <= in_stack_ffffffffffffff10) break;
      std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::operator[]
                (local_40,(ulong)local_50);
      Imath_3_2::Vec3<short>::operator-(in_stack_fffffffffffffef8);
      pvVar6 = std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::
               operator[](local_40,(ulong)local_54);
      Imath_3_2::Vec3<short>::Vec3(local_60,pvVar6);
      Imath_3_2::Box<Imath_3_2::Vec3<short>_>::Box(in_stack_ffffffffffffff00);
      Imath_3_2::Box<Imath_3_2::Vec3<short>_>::Box
                (in_stack_ffffffffffffff10,&in_stack_ffffffffffffff08->min,
                 &in_stack_ffffffffffffff00->min);
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                        (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!(b0 == b1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x18d,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                     );
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                        (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if (!bVar1) {
        __assert_fail("b0 != b1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x18e,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                     );
      }
      local_54 = local_54 + 1;
    }
  }
  std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::~vector
            ((vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> *)
             in_stack_ffffffffffffff10);
  pBVar5 = (Box<Imath_3_2::Vec3<short>_> *)local_90;
  std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::vector
            ((vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> *)0x11b650);
  permutations<Imath_3_2::Vec3<short>>(in_stack_ffffffffffffff40);
  local_94 = 0;
  do {
    maxT = (Vec3<short> *)(ulong)local_94;
    pVVar7 = (Vec3<short> *)
             std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::size
                       (local_90);
    if (pVVar7 <= maxT) {
      std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::~vector
                ((vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> *)
                 in_stack_ffffffffffffff10);
      return;
    }
    local_98 = 0;
    while( true ) {
      pVVar7 = (Vec3<short> *)(ulong)local_98;
      pVVar8 = (Vec3<short> *)
               std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::size
                         (local_90);
      if (pVVar8 <= pVVar7) break;
      std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::operator[]
                (local_90,(ulong)local_94);
      Imath_3_2::Vec3<short>::operator-(pVVar7);
      pvVar6 = std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::
               operator[](local_90,(ulong)local_98);
      Imath_3_2::Vec3<short>::Vec3(local_a4,pvVar6);
      std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::operator[]
                (local_90,(ulong)local_98);
      Imath_3_2::Vec3<short>::operator-(pVVar7);
      pvVar6 = std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::
               operator[](local_90,(ulong)local_94);
      Imath_3_2::Vec3<short>::Vec3(local_b0,pvVar6);
      Imath_3_2::Box<Imath_3_2::Vec3<short>_>::Box(in_stack_ffffffffffffff10,&pBVar5->min,maxT);
      Imath_3_2::Box<Imath_3_2::Vec3<short>_>::Box(in_stack_ffffffffffffff10,&pBVar5->min,maxT);
      Imath_3_2::Box<Imath_3_2::Vec3<short>_>::Box(in_stack_ffffffffffffff10,&pBVar5->min,maxT);
      if (local_94 == local_98) {
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                          (in_stack_ffffffffffffff10,pBVar5);
        if (!bVar1) {
          __assert_fail("b0 == b1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1aa,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                       );
        }
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                          (in_stack_ffffffffffffff10,pBVar5);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!(b0 != b1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1ab,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                       );
        }
      }
      else {
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                          (in_stack_ffffffffffffff10,pBVar5);
        if (!bVar1) {
          __assert_fail("b0 != b1",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1af,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                       );
        }
        bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                          (in_stack_ffffffffffffff10,pBVar5);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!(b0 == b1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                        ,0x1b0,
                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                       );
        }
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==(in_stack_ffffffffffffff10,pBVar5);
      if (!bVar1) {
        __assert_fail("b0 == b2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x1b2,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                     );
      }
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=(in_stack_ffffffffffffff10,pBVar5);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!(b0 != b2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x1b3,
                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                     );
      }
      local_98 = local_98 + 1;
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

void
testComparators (const char* type)
{
    cout << "    comparators for type " << type << endl;

    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);

    //
    // Compare empty.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0;
        IMATH_INTERNAL_NAMESPACE::Box<T> b1;

        assert (b0 == b1);
        assert (!(b0 != b1));
    }

    //
    // Compare empty to non-empty.
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
                assert (!(b0 == b1));
                assert (b0 != b1);
            }
        }
    }

    //
    // Compare two non-empty
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                T p2 = -perms[j];
                T p3 = perms[i];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0 (p0, p1);
                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p2, p3);
                IMATH_INTERNAL_NAMESPACE::Box<T> b2 (p0, p1);

                if (i == j)
                {
                    assert (b0 == b1);
                    assert (!(b0 != b1));
                }
                else
                {
                    assert (b0 != b1);
                    assert (!(b0 == b1));
                }
                assert (b0 == b2);
                assert (!(b0 != b2));
            }
        }
    }
}